

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O1

void separate(vector<const_char_*,_std::allocator<const_char_*>_> *in,char *out,bool override)

{
  pointer ppcVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  MultiPartInputFile *this;
  long *plVar6;
  ostream *poVar7;
  Header *pHVar8;
  invalid_argument *this_00;
  undefined7 in_register_00000011;
  long lVar9;
  string outfilename;
  MultiPartOutputFile out_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fornamecheck;
  string filename;
  MultiPartInputFile temp;
  ostringstream oss;
  value_type local_268;
  undefined8 local_248;
  undefined4 local_23c;
  MultiPartOutputFile local_238;
  undefined7 uStack_237;
  long local_228 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_1f8;
  long *local_1f0 [2];
  long local_1e0 [2];
  MultiPartInputFile local_1d0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  allocator<char> local_1a8 [112];
  ios_base local_138 [264];
  
  local_23c = (undefined4)CONCAT71(in_register_00000011,override);
  ppcVar1 = (in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_248 = out;
  local_1f8 = in;
  if ((ulong)((long)(in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppcVar1) < 9) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1f0,*ppcVar1,local_1a8);
    plVar6 = local_1f0[0];
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_1d0,(char *)plVar6,iVar3,true);
    this = (MultiPartInputFile *)operator_new(0x10);
    plVar6 = local_1f0[0];
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile(this,(char *)plVar6,iVar3,true);
    uVar4 = Imf_3_2::MultiPartInputFile::parts();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numOutputs: ",0xc);
    plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    if (0 < (int)uVar4) {
      iVar3 = 1;
      do {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,local_248,local_1a8)
        ;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        local_238 = (MultiPartOutputFile)0x2e;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_238,1);
        std::ostream::operator<<((ostream *)poVar7,iVar3);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)&local_268,CONCAT71(uStack_237,local_238));
        if ((long *)CONCAT71(uStack_237,local_238) != local_228) {
          operator_delete((long *)CONCAT71(uStack_237,local_238),local_228[0] + 1);
        }
        std::__cxx11::string::append((char *)&local_268);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"outputfilename: ",0x10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_268._M_dataplus._M_p,
                            local_268._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_218,&local_268);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        iVar5 = (1 - uVar4) + iVar3;
        iVar3 = iVar3 + 1;
      } while (iVar5 != 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,&local_218);
    filename_check(&local_1c0,
                   *(local_1f8->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                    _M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
    if (0 < (int)uVar4) {
      lVar9 = 0;
      local_248 = (char *)(CONCAT44(local_248._4_4_,local_23c) & 0xffffffff000000ff);
      iVar3 = 0;
      do {
        pHVar8 = (Header *)Imf_3_2::MultiPartInputFile::header((int)this);
        Imf_3_2::Header::Header((Header *)local_1a8,pHVar8);
        pcVar2 = *(char **)((long)&((local_218.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar9);
        iVar5 = Imf_3_2::globalThreadCount();
        Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                  (&local_238,pcVar2,(Header *)local_1a8,1,SUB81(local_248,0),iVar5);
        plVar6 = (long *)Imf_3_2::Header::type_abi_cxx11_();
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_268,*plVar6,plVar6[1] + *plVar6);
        iVar5 = std::__cxx11::string::compare((char *)&local_268);
        if (iVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"scanlineimage",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
          std::ostream::put('\x18');
          std::ostream::flush();
          copy_scanline(this,&local_238,iVar3,0);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_268);
          if (iVar5 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"tiledimage",10);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
            std::ostream::put('\x18');
            std::ostream::flush();
            copy_tile(this,&local_238,iVar3,0);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_268);
            if (iVar5 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"deepscanline",0xc);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
              std::ostream::put('\x18');
              std::ostream::flush();
              copy_scanlinedeep(this,&local_238,iVar3,0);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&local_268);
              if (iVar5 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"deeptile",8);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
                std::ostream::put('\x18');
                std::ostream::flush();
                copy_tiledeep(this,&local_238,iVar3,0);
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&local_238);
        Imf_3_2::Header::~Header((Header *)local_1a8);
        iVar3 = iVar3 + 1;
        lVar9 = lVar9 + 0x20;
      } while ((ulong)uVar4 << 5 != lVar9);
    }
    (**(code **)(*(long *)this + 8))();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Separate Success",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_1d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"-separate only take one input file");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
separate (vector<const char*> in, const char* out, bool override)
{
    if (in.size () > 1)
        throw invalid_argument("-separate only take one input file");

    //
    // parse the multipart input
    //
    string              filename (in[0]);
    MultiPartInputFile* inputimage;
    int                 numOutputs;
    vector<string>      fornamecheck;

    // add check for existence of the file
    MultiPartInputFile temp (filename.c_str ());

    inputimage = new MultiPartInputFile (filename.c_str ());
    numOutputs = inputimage->parts ();
    cout << "numOutputs: " << numOutputs << endl;

    //
    // set outputs names
    //
    for (int p = 0; p < numOutputs; p++)
    {
        string outfilename (out);

        //add number to outfilename
        std::ostringstream oss;
        oss << '.' << p + 1;
        outfilename += oss.str ();
        outfilename += ".exr";
        cout << "outputfilename: " << outfilename << endl;
        fornamecheck.push_back (outfilename);
    }

    filename_check (fornamecheck, in[0]);

    //
    // separate outputs
    //
    for (int p = 0; p < numOutputs; p++)
    {
        Header header = inputimage->header (p);

        MultiPartOutputFile out (
            fornamecheck[p].c_str (), &header, 1, override);

        std::string type = header.type ();
        if (type == "scanlineimage")
        {
            cout << "scanlineimage" << endl;
            copy_scanline (*inputimage, out, p, 0);
        }
        else if (type == "tiledimage")
        {
            cout << "tiledimage" << endl;
            copy_tile (*inputimage, out, p, 0);
        }
        else if (type == "deepscanline")
        {
            cout << "deepscanline" << endl;
            copy_scanlinedeep (*inputimage, out, p, 0);
        }
        else if (type == "deeptile")
        {
            cout << "deeptile" << endl;
            copy_tiledeep (*inputimage, out, p, 0);
        }
    }

    delete inputimage;
    cout << "\n"
         << "Separate Success" << endl;
}